

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::WriteExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT cum_weight_constant,int epcalc,int eptype,int eptype_tvar,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting,int samplesize)

{
  pointer *ppTVar1;
  double dVar2;
  iterator __position;
  long lVar3;
  pointer plVar4;
  bool bVar5;
  ulong uVar6;
  mapped_type *this_00;
  code *pcVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  pointer plVar10;
  long *plVar11;
  int counter;
  _Rb_tree_header *p_Var12;
  float current_loss;
  size_t nextreturnperiodindex;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> s;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  float local_f8;
  double local_e8;
  pointer local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  int local_a8;
  float local_a4;
  double local_a0;
  _Rb_tree_color local_98 [2];
  vector<lossval,_std::allocator<lossval>_> local_90;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  local_60;
  
  if ((samplesize != 0) && ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var9 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(items->_M_t)._M_impl.super__Rb_tree_header;
    local_a8 = eptype_tvar;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var9 != p_Var12) {
      local_a0 = (double)cum_weight_constant;
      local_a4 = (float)samplesize;
      local_68 = &(unusedperiodstoweighting->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_78 = &p_Var12->_M_header;
      do {
        local_98[0] = p_Var9[1]._M_color;
        local_70 = p_Var9;
        std::vector<lossval,_std::allocator<lossval>_>::vector
                  (&local_90,(vector<lossval,_std::allocator<lossval>_> *)&p_Var9[1]._M_parent);
        plVar10 = local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        plVar4 = local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          local_d8._0_8_ =
               local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_e0 = local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                     super__Vector_impl_data._M_start;
          uVar6 = ((long)local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar3 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          std::
          __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_d8,&local_e0,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
          local_b8 = plVar10;
          local_c0 = plVar4;
          std::
          __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_b8,&local_c0);
        }
        plVar4 = local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_e0 = (pointer)0x0;
        local_b8 = (pointer)0x0;
        local_c0 = (pointer)((ulong)local_c0 & 0xffffffff00000000);
        if (local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_f8 = 0.0;
          counter = 1;
          local_c8 = 0.0;
          local_e8 = 0.0;
        }
        else {
          local_e8 = 0.0;
          counter = 1;
          local_f8 = 0.0;
          bVar5 = false;
          local_c8 = 0.0;
          plVar10 = local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            dVar2 = plVar10->period_weighting;
            local_e8 = dVar2 * local_a0 + local_e8;
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              local_b0 = (pointer)(1.0 / local_e8);
              if (!bVar5) {
                local_c8 = (double)local_b0 + 0.0001;
              }
              current_loss = plVar10->value / local_a4;
              if (this->useReturnPeriodFile_ == true) {
                local_d8._0_8_ = this->WriteEPTOutput;
                local_d8._8_8_ = *(undefined8 *)&this->field_0x158;
                WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                          (this,fileIDs,(size_t *)&local_e0,(double *)&local_b8,
                           (OASIS_FLOAT *)&local_c0,(double)local_b0,current_loss,local_98[0],eptype
                           ,epcalc,local_c8,counter,local_f8,
                           (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                            *)&local_60,local_d8._0_8_,
                           (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                            *)local_d8._8_8_);
                local_f8 = local_f8 - (local_f8 - current_loss) / (float)counter;
              }
              else {
                this_00 = std::
                          map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                          ::operator[]((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                        *)&local_60,(key_type *)local_98);
                local_f8 = local_f8 - (local_f8 - current_loss) / (float)counter;
                local_d8._0_8_ = local_b0;
                local_d8._8_4_ = local_f8;
                __position._M_current =
                     (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<TVaR,_std::allocator<TVaR>_>::_M_realloc_insert<TVaR>
                            (this_00,__position,(TVaR *)local_d8);
                }
                else {
                  (__position._M_current)->retperiod = (double)local_b0;
                  *(undefined8 *)&(__position._M_current)->tvar = local_d8._8_8_;
                  ppTVar1 = &(this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                  *ppTVar1 = *ppTVar1 + 1;
                }
                pcVar7 = (code *)this->WriteEPTOutput;
                if (pcVar7 != (code *)0x0) {
                  plVar11 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
                  if (((ulong)pcVar7 & 1) != 0) {
                    pcVar7 = *(code **)(pcVar7 + *plVar11 + -1);
                  }
                  (*pcVar7)((int)local_b0,current_loss,plVar11,fileIDs,local_98[0],epcalc,eptype);
                }
              }
              counter = counter + 1;
              bVar5 = true;
            }
            plVar10 = plVar10 + 1;
          } while (plVar10 != plVar4);
        }
        if (this->useReturnPeriodFile_ != false) {
          p_Var8 = (unusedperiodstoweighting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (p_Var8 == local_68) {
              dVar2 = 0.0;
            }
            else {
              local_e8 = local_e8 + (double)p_Var8[1]._M_parent * local_a0;
              dVar2 = 1.0 / local_e8;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            }
            local_d8._0_8_ = this->WriteEPTOutput;
            local_d8._8_8_ = *(undefined8 *)&this->field_0x158;
            WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,(size_t *)&local_e0,(double *)&local_b8,(OASIS_FLOAT *)&local_c0
                       ,dVar2,0.0,local_98[0],eptype,epcalc,local_c8,counter,local_f8,
                       (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        *)&local_60,local_d8._0_8_,
                       (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                        *)local_d8._8_8_);
            local_f8 = local_f8 - local_f8 / (float)counter;
            counter = counter + 1;
          } while (local_e0 <
                   (pointer)((long)(this->returnperiods_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this->returnperiods_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
        }
        if (local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_70);
      } while (p_Var9 != local_78);
    }
    if ((this->ordFlag_ != false) && (*this->fout_ != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,epcalc,local_a8,
                (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&local_60);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void aggreports::WriteExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<int, lossvec2> &items,
	const OASIS_FLOAT cum_weight_constant,
	int epcalc, int eptype, int eptype_tvar,
	std::map<int, double> &unusedperiodstoweighting, int samplesize) {

  if (items.size() == 0) return;
  if (samplesize == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
  	if (parquetFileNames_[EPT] != "") {
		os_ept_ = GetParquetStreamWriter(EPT);
		os_ept_exists_ = true;
	}
  }
#endif

  std::map<int, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec2 &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;
    double cumulative_weighting = 0;
    double max_retperiod = 0;
    bool largest_loss = false;

    for (auto lp : lpv) {
      cumulative_weighting += (lp.period_weighting * cum_weight_constant);

      if (lp.period_weighting) {
	double retperiod = 1 / cumulative_weighting;

	if (!largest_loss) {
	  max_retperiod = retperiod + 0.0001;   // Add for floating point errors
	  largest_loss = true;
	}

	if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value / samplesize, s.first, eptype, epcalc,
			       max_retperiod, i, tvar, tail, WriteEPTOutput,
			       os_ept_);
#else
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value / samplesize, s.first, eptype, epcalc,
			       max_retperiod, i, tvar, tail, WriteEPTOutput);
#endif
	  tvar = tvar - ((tvar - (lp.value / samplesize)) / i);
	} else {
	  tvar = tvar - ((tvar - (lp.value / samplesize)) / i);
	  tail[s.first].push_back({retperiod, tvar});
	  if (WriteEPTOutput != nullptr) {
	    (this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, retperiod,
				    lp.value / samplesize);
	  }
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	  if (parquetFileNames_[EPT] != "") {
	    WriteParquetOutput(os_ept_, s.first, epcalc, eptype, retperiod,
			       lp.value / samplesize);
	  }
#endif
	}
	i++;
      }
    }
    if (useReturnPeriodFile_) {
      auto iter = unusedperiodstoweighting.begin();
      do {
	double retperiod = 0;
	if (iter != unusedperiodstoweighting.end()) {
	  cumulative_weighting += (iter->second * cum_weight_constant);
	  retperiod = 1 / cumulative_weighting;
	  ++iter;
	}
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[EPT] != nullptr) WriteTVaR(fileIDs, epcalc, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[EPT] != "") {
    WriteTVaR(os_ept_, epcalc, eptype_tvar, tail);
  }
#endif

}